

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

void __thiscall
irr::video::CNullDriver::makeColorKeyTexture(CNullDriver *this,ITexture *texture,SColor color)

{
  dimension2d<unsigned_int> dVar1;
  u16 uVar2;
  ECOLOR_FORMAT EVar3;
  int iVar4;
  u32 uVar5;
  undefined4 extraout_var;
  dimension2d<unsigned_int> *pdVar6;
  undefined4 extraout_var_00;
  uint in_EDX;
  ITexture *in_RSI;
  double __x;
  double __x_00;
  double __x_01;
  u32 pixel_1;
  u32 pixels_1;
  u32 refZeroAlpha_1;
  u32 pitch_1;
  dimension2d<unsigned_int> dim_1;
  u32 *p_1;
  u32 pixel;
  u32 pixels;
  u16 refZeroAlpha;
  u32 pitch;
  dimension2d<unsigned_int> dim;
  u16 *p;
  uint local_58;
  uint uStack_44;
  uint *local_40;
  uint local_38;
  uint uStack_24;
  ushort *local_20;
  
  if (in_RSI != (ITexture *)0x0) {
    EVar3 = ITexture::getColorFormat(in_RSI);
    if ((EVar3 == ECF_A1R5G5B5) || (EVar3 = ITexture::getColorFormat(in_RSI), EVar3 == ECF_A8R8G8B8)
       ) {
      EVar3 = ITexture::getColorFormat(in_RSI);
      if (EVar3 == ECF_A1R5G5B5) {
        iVar4 = (**in_RSI->_vptr_ITexture)(in_RSI,0,0,0,1);
        local_20 = (ushort *)CONCAT44(extraout_var,iVar4);
        if (local_20 == (ushort *)0x0) {
          os::Printer::log((Printer *)"Could not lock texture for making color key channel.",__x_00)
          ;
          return;
        }
        pdVar6 = ITexture::getSize(in_RSI);
        dVar1 = *pdVar6;
        uVar5 = ITexture::getPitch(in_RSI);
        uVar2 = SColor::toA1R5G5B5((SColor *)0x30b04b);
        uStack_24 = dVar1.Height;
        for (local_38 = 0; local_38 < (uVar5 >> 1) * uStack_24; local_38 = local_38 + 1) {
          if ((*local_20 & 0x7fff) == (uVar2 & 0x7fff)) {
            *local_20 = uVar2 & 0x7fff;
          }
          local_20 = local_20 + 1;
        }
        (*in_RSI->_vptr_ITexture[1])();
      }
      else {
        iVar4 = (**in_RSI->_vptr_ITexture)(in_RSI,0,0,0,1);
        local_40 = (uint *)CONCAT44(extraout_var_00,iVar4);
        if (local_40 == (uint *)0x0) {
          os::Printer::log((Printer *)"Could not lock texture for making color key channel.",__x_01)
          ;
          return;
        }
        pdVar6 = ITexture::getSize(in_RSI);
        dVar1 = *pdVar6;
        uVar5 = ITexture::getPitch(in_RSI);
        uStack_44 = dVar1.Height;
        for (local_58 = 0; local_58 < (uVar5 >> 2) * uStack_44; local_58 = local_58 + 1) {
          if ((*local_40 & 0xffffff) == (in_EDX & 0xffffff)) {
            *local_40 = in_EDX & 0xffffff;
          }
          local_40 = local_40 + 1;
        }
        (*in_RSI->_vptr_ITexture[1])();
      }
      (*in_RSI->_vptr_ITexture[2])(in_RSI,0,0);
    }
    else {
      os::Printer::log((Printer *)
                       "Error: Unsupported texture color format for making color key channel.",__x);
    }
  }
  return;
}

Assistant:

void CNullDriver::makeColorKeyTexture(video::ITexture *texture,
		video::SColor color) const
{
	if (!texture)
		return;

	if (texture->getColorFormat() != ECF_A1R5G5B5 &&
			texture->getColorFormat() != ECF_A8R8G8B8) {
		os::Printer::log("Error: Unsupported texture color format for making color key channel.", ELL_ERROR);
		return;
	}

	if (texture->getColorFormat() == ECF_A1R5G5B5) {
		u16 *p = (u16 *)texture->lock();

		if (!p) {
			os::Printer::log("Could not lock texture for making color key channel.", ELL_ERROR);
			return;
		}

		const core::dimension2d<u32> dim = texture->getSize();
		const u32 pitch = texture->getPitch() / 2;

		// color with alpha disabled (i.e. fully transparent)
		const u16 refZeroAlpha = (0x7fff & color.toA1R5G5B5());

		const u32 pixels = pitch * dim.Height;

		for (u32 pixel = 0; pixel < pixels; ++pixel) {
			// If the color matches the reference color, ignoring alphas,
			// set the alpha to zero.
			if (((*p) & 0x7fff) == refZeroAlpha)
				(*p) = refZeroAlpha;

			++p;
		}

		texture->unlock();
	} else {
		u32 *p = (u32 *)texture->lock();

		if (!p) {
			os::Printer::log("Could not lock texture for making color key channel.", ELL_ERROR);
			return;
		}

		core::dimension2d<u32> dim = texture->getSize();
		u32 pitch = texture->getPitch() / 4;

		// color with alpha disabled (fully transparent)
		const u32 refZeroAlpha = 0x00ffffff & color.color;

		const u32 pixels = pitch * dim.Height;
		for (u32 pixel = 0; pixel < pixels; ++pixel) {
			// If the color matches the reference color, ignoring alphas,
			// set the alpha to zero.
			if (((*p) & 0x00ffffff) == refZeroAlpha)
				(*p) = refZeroAlpha;

			++p;
		}

		texture->unlock();
	}
	texture->regenerateMipMapLevels();
}